

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

_Bool sysbvm_tuple_isTypeSatisfiedWithValue
                (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t value)

{
  _Bool _Var1;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  if ((value == 0) && (_Var1 = sysbvm_type_isNullable(type), _Var1)) {
    context_local._7_1_ = true;
  }
  else {
    context_local._7_1_ = sysbvm_tuple_isKindOf(context,value,type);
  }
  return context_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_tuple_isTypeSatisfiedWithValue(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t value)
{
    if(!value && sysbvm_type_isNullable(type))
        return true;
    return sysbvm_tuple_isKindOf(context, value, type);
}